

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uLong deflateBound(z_streamp strm,uLong sourceLen)

{
  Bytef BVar1;
  internal_state *piVar2;
  int iVar3;
  ulong uVar4;
  ulong local_60;
  ulong local_50;
  Bytef *local_48;
  Bytef *str;
  uLong wraplen;
  uLong storelen;
  uLong fixedlen;
  deflate_state *s;
  uLong sourceLen_local;
  z_streamp strm_local;
  
  uVar4 = sourceLen + (sourceLen >> 3) + (sourceLen >> 8) + (sourceLen >> 9) + 4;
  local_60 = sourceLen + (sourceLen >> 5) + (sourceLen >> 7) + (sourceLen >> 0xb) + 7;
  iVar3 = deflateStateCheck(strm);
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar3 = piVar2->wrap;
    if (iVar3 == 0) {
      str = (Bytef *)0x0;
    }
    else if (iVar3 == 1) {
      iVar3 = 0;
      if (piVar2->strstart != 0) {
        iVar3 = 4;
      }
      str = (Bytef *)(long)(iVar3 + 6);
    }
    else if (iVar3 == 2) {
      str = (Bytef *)0x12;
      if (piVar2->gzhead != (gz_headerp)0x0) {
        if (piVar2->gzhead->extra != (Bytef *)0x0) {
          str = (Bytef *)((ulong)(piVar2->gzhead->extra_len + 2) + 0x12);
        }
        local_48 = piVar2->gzhead->name;
        if (local_48 != (Bytef *)0x0) {
          do {
            str = str + 1;
            BVar1 = *local_48;
            local_48 = local_48 + 1;
          } while (BVar1 != '\0');
        }
        local_48 = piVar2->gzhead->comment;
        if (local_48 != (Bytef *)0x0) {
          do {
            str = str + 1;
            BVar1 = *local_48;
            local_48 = local_48 + 1;
          } while (BVar1 != '\0');
        }
        if (piVar2->gzhead->hcrc != 0) {
          str = str + 2;
        }
      }
    }
    else {
      str = (Bytef *)0x6;
    }
    if ((piVar2->w_bits == 0xf) && (piVar2->hash_bits == 0xf)) {
      strm_local = (z_streamp)
                   (str + sourceLen + (sourceLen >> 0xc) + (sourceLen >> 0xe) + (sourceLen >> 0x19)
                          + 7);
    }
    else {
      if ((piVar2->w_bits <= piVar2->hash_bits) && (piVar2->level != 0)) {
        local_60 = uVar4;
      }
      strm_local = (z_streamp)(str + local_60);
    }
  }
  else {
    local_50 = local_60;
    if (local_60 < uVar4) {
      local_50 = uVar4;
    }
    strm_local = (z_streamp)(local_50 + 6);
  }
  return (uLong)strm_local;
}

Assistant:

uLong ZEXPORT deflateBound(z_streamp strm, uLong sourceLen) {
    deflate_state *s;
    uLong fixedlen, storelen, wraplen;

    /* upper bound for fixed blocks with 9-bit literals and length 255
       (memLevel == 2, which is the lowest that may not use stored blocks) --
       ~13% overhead plus a small constant */
    fixedlen = sourceLen + (sourceLen >> 3) + (sourceLen >> 8) +
               (sourceLen >> 9) + 4;

    /* upper bound for stored blocks with length 127 (memLevel == 1) --
       ~4% overhead plus a small constant */
    storelen = sourceLen + (sourceLen >> 5) + (sourceLen >> 7) +
               (sourceLen >> 11) + 7;

    /* if can't get parameters, return larger bound plus a zlib wrapper */
    if (deflateStateCheck(strm))
        return (fixedlen > storelen ? fixedlen : storelen) + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            Bytef *str;
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* if not default parameters, return one of the conservative bounds */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return (s->w_bits <= s->hash_bits && s->level ? fixedlen : storelen) +
               wraplen;

    /* default settings: return tight bound for that case -- ~0.03% overhead
       plus a small constant */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}